

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,const_iterator begin,const_iterator end,Style style)

{
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  char *local_50;
  SmallVectorImpl<char> *local_48;
  size_t local_40;
  Style local_34;
  
  local_50 = end.Path.Data;
  local_40 = end.Position;
  local_48 = path;
  local_34 = style;
  while ((begin.Path.Data != local_50 || (begin.Position != local_40))) {
    Twine::Twine(&local_68,&begin.Component);
    Twine::Twine(&local_b0,"");
    Twine::Twine(&local_98,"");
    Twine::Twine(&local_80,"");
    append(local_48,local_34,&local_68,&local_b0,&local_98,&local_80);
    const_iterator::operator++(&begin);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, const_iterator begin,
            const_iterator end, Style style) {
  for (; begin != end; ++begin)
    path::append(path, style, *begin);
}